

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O0

int loadfunc(lua_State *L,char *filename,char *modname)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  int stat;
  char *mark;
  char *openfunc;
  char *modname_local;
  char *filename_local;
  lua_State *L_local;
  
  openfunc = luaL_gsub(L,modname,".","_");
  pcVar2 = strchr(openfunc,0x2d);
  if (pcVar2 != (char *)0x0) {
    pcVar3 = lua_pushlstring(L,openfunc,(long)pcVar2 - (long)openfunc);
    pcVar3 = lua_pushfstring(L,"luaopen_%s",pcVar3);
    iVar1 = lookforfunc(L,filename,pcVar3);
    if (iVar1 != 2) {
      return iVar1;
    }
    openfunc = pcVar2 + 1;
  }
  pcVar2 = lua_pushfstring(L,"luaopen_%s",openfunc);
  iVar1 = lookforfunc(L,filename,pcVar2);
  return iVar1;
}

Assistant:

static int loadfunc(lua_State *L, const char *filename, const char *modname) {
    const char *openfunc;
    const char *mark;
    modname = luaL_gsub(L, modname, ".", LUA_OFSEP);
    mark = strchr(modname, *LUA_IGMARK);
    if (mark) {
        int stat;
        openfunc = lua_pushlstring(L, modname, mark - modname);
        openfunc = lua_pushfstring(L, LUA_POF"%s", openfunc);
        stat = lookforfunc(L, filename, openfunc);
        if (stat != ERRFUNC) return stat;
        modname = mark + 1;  /* else go ahead and try old-style name */
    }
    openfunc = lua_pushfstring(L, LUA_POF"%s", modname);
    return lookforfunc(L, filename, openfunc);
}